

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_chunked(Stream *strm,string *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  size_t len;
  FILE *__stream;
  size_t *__n;
  size_t *extraout_RDX;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  size_t *extraout_RDX_00;
  Stream *__lineptr;
  string *out_00;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [32];
  undefined1 local_d8 [8];
  string chunk;
  string local_b0;
  int local_8c;
  int local_88;
  int chunk_len;
  undefined1 local_78 [8];
  stream_line_reader reader;
  char buf [16];
  int bufsiz;
  string *out_local;
  Stream *strm_local;
  
  __stream = (FILE *)0x10;
  __lineptr = strm;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_78,strm,reader.glowable_buffer_.field_2._M_local_buf + 8,
             0x10);
  uVar3 = stream_line_reader::getline
                    ((stream_line_reader *)local_78,(char **)__lineptr,__n,__stream);
  if ((uVar3 & 1) == 0) {
    strm_local._7_1_ = 0;
    local_88 = 1;
    goto LAB_001fce45;
  }
  pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,pcVar4,(allocator *)(chunk.field_2._M_local_buf + 0xf));
  out_00 = (string *)0x0;
  iVar2 = std::__cxx11::stoi(&local_b0,(size_t *)0x0,0x10);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(chunk.field_2._M_local_buf + 0xf));
  __n_00 = extraout_RDX;
  local_8c = iVar2;
  do {
    if (local_8c < 1) goto LAB_001fcde8;
    out_00 = (string *)local_d8;
    std::__cxx11::string::string((string *)out_00);
    len = (size_t)local_8c;
    __stream = (FILE *)local_f8;
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)__stream,(nullptr_t)0x0);
    bVar1 = read_content_with_length(strm,out_00,len,(Progress *)__stream);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function
              ((function<bool_(unsigned_long,_unsigned_long)> *)local_f8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uVar3 = stream_line_reader::getline
                        ((stream_line_reader *)local_78,(char **)out_00,__n_01,__stream);
      if ((uVar3 & 1) == 0) {
        strm_local._7_1_ = 0;
        local_88 = 1;
      }
      else {
        pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
        out_00 = (string *)0x22c4fd;
        iVar2 = strcmp(pcVar4,"\r\n");
        if (iVar2 == 0) {
          out_00 = (string *)local_d8;
          std::__cxx11::string::operator+=((string *)out,(string *)out_00);
          uVar3 = stream_line_reader::getline
                            ((stream_line_reader *)local_78,(char **)out_00,__n_02,__stream);
          if ((uVar3 & 1) == 0) {
            strm_local._7_1_ = 0;
            local_88 = 1;
          }
          else {
            pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_118,pcVar4,&local_119);
            out_00 = (string *)0x0;
            local_8c = std::__cxx11::stoi(&local_118,(size_t *)0x0,0x10);
            std::__cxx11::string::~string((string *)&local_118);
            std::allocator<char>::~allocator((allocator<char> *)&local_119);
            local_88 = 0;
          }
        }
        else {
          local_88 = 3;
        }
      }
    }
    else {
      strm_local._7_1_ = 0;
      local_88 = 1;
    }
    std::__cxx11::string::~string((string *)local_d8);
    __n_00 = extraout_RDX_00;
  } while (local_88 == 0);
  if (local_88 != 3) goto LAB_001fce45;
LAB_001fcde8:
  if (local_8c == 0) {
    uVar3 = stream_line_reader::getline
                      ((stream_line_reader *)local_78,(char **)out_00,__n_00,__stream);
    if ((uVar3 & 1) != 0) {
      pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
      iVar2 = strcmp(pcVar4,"\r\n");
      if (iVar2 == 0) goto LAB_001fce3a;
    }
    strm_local._7_1_ = 0;
    local_88 = 1;
  }
  else {
LAB_001fce3a:
    strm_local._7_1_ = 1;
    local_88 = 1;
  }
LAB_001fce45:
  stream_line_reader::~stream_line_reader((stream_line_reader *)local_78);
  return (bool)(strm_local._7_1_ & 1);
}

Assistant:

inline bool read_content_chunked(Stream& strm, std::string& out)
{
    const auto bufsiz = 16;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    if (!reader.getline()) {
        return false;
    }

    auto chunk_len = std::stoi(reader.ptr(), 0, 16);

    while (chunk_len > 0){
        std::string chunk;
        if (!read_content_with_length(strm, chunk, chunk_len, nullptr)) {
            return false;
        }

        if (!reader.getline()) {
            return false;
        }

        if (strcmp(reader.ptr(), "\r\n")) {
            break;
        }

        out += chunk;

        if (!reader.getline()) {
            return false;
        }

        chunk_len = std::stoi(reader.ptr(), 0, 16);
    }

    if (chunk_len == 0) {
        // Reader terminator after chunks
        if (!reader.getline() || strcmp(reader.ptr(), "\r\n"))
            return false;
    }

    return true;
}